

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_http_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  undefined1 *puVar1;
  connectdata *conn;
  
  conn = data->conn;
  puVar1 = &(data->state).authhost.field_0x18;
  *puVar1 = *puVar1 & 0xfd;
  puVar1 = &(data->state).authproxy.field_0x18;
  *puVar1 = *puVar1 & 0xfd;
  Curl_dyn_reset(&(data->state).headerb);
  if (status == CURLE_OK && !premature) {
    status = CURLE_OK;
    if (((((conn->bits).field_0x1 & 0x40) == 0) && ((data->set).connect_only == '\0')) &&
       (status = CURLE_OK,
       (long)((ulong)(data->req).headerbytecount + (data->req).bytecount) <=
       (long)(ulong)(data->req).deductheadercount)) {
      Curl_failf(data,"Empty reply from server");
      Curl_conncontrol(conn,2);
      status = CURLE_GOT_NOTHING;
    }
  }
  return status;
}

Assistant:

CURLcode Curl_http_done(struct Curl_easy *data,
                        CURLcode status, bool premature)
{
  struct connectdata *conn = data->conn;

  /* Clear multipass flag. If authentication is not done yet, then it will get
   * a chance to be set back to true when we output the next auth header */
  data->state.authhost.multipass = FALSE;
  data->state.authproxy.multipass = FALSE;

  Curl_dyn_reset(&data->state.headerb);
  Curl_hyper_done(data);

  if(status)
    return status;

  if(!premature && /* this check is pointless when DONE is called before the
                      entire operation is complete */
     !conn->bits.retry &&
     !data->set.connect_only &&
     (data->req.bytecount +
      data->req.headerbytecount -
      data->req.deductheadercount) <= 0) {
    /* If this connection is not simply closed to be retried, AND nothing was
       read from the HTTP server (that counts), this cannot be right so we
       return an error here */
    failf(data, "Empty reply from server");
    /* Mark it as closed to avoid the "left intact" message */
    streamclose(conn, "Empty reply from server");
    return CURLE_GOT_NOTHING;
  }

  return CURLE_OK;
}